

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O1

Abc_Cex_t * Saig_RefManRunSat(Saig_RefMan_t *p,int fNewOrder)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void **ppvVar4;
  lit *begin;
  int iVar5;
  Cnf_Dat_t *pCnf;
  sat_solver *s;
  Vec_Int_t *vVar2PiId;
  int *__s;
  Vec_Int_t *p_00;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Vec_t *pVVar8;
  Abc_Cex_t *pAVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  char *__s_00;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  timespec ts;
  timespec local_40;
  
  clock_gettime(3,&local_40);
  if (p->pFrames->nRegs != 0) {
    __assert_fail("Aig_ManRegNum(p->pFrames) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldSat.c"
                  ,0x203,"Abc_Cex_t *Saig_RefManRunSat(Saig_RefMan_t *, int)");
  }
  pCnf = Cnf_DeriveSimple(p->pFrames,0);
  iVar5 = Saig_RefManSetPhases(p,(Abc_Cex_t *)0x0,0);
  if (iVar5 == 0) {
    Cnf_DataTranformPolarity(pCnf,0);
    s = (sat_solver *)Cnf_DataWriteIntoSolver(pCnf,1,0);
    if (s != (sat_solver *)0x0) {
      if ((0 < p->nInputs) &&
         (iVar5 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,1000000,0,0,0), iVar5 == -1)) {
        puts("The problem is trivially UNSAT. The CEX is real.");
        pAVar9 = Abc_CexDup(p->pCex,p->pCex->nRegs);
        memset(pAVar9 + 1,0,
               (long)(int)(((pAVar9->nBits >> 5) + 1) - (uint)((pAVar9->nBits & 0x1fU) == 0)) << 2);
        return pAVar9;
      }
      iVar5 = pCnf->nVars;
      vVar2PiId = (Vec_Int_t *)malloc(0x10);
      iVar10 = 0x10;
      if (0xe < iVar5 - 1U) {
        iVar10 = iVar5;
      }
      vVar2PiId->nSize = 0;
      vVar2PiId->nCap = iVar10;
      if (iVar10 == 0) {
        __s = (int *)0x0;
      }
      else {
        __s = (int *)malloc((long)iVar10 << 2);
      }
      vVar2PiId->pArray = __s;
      vVar2PiId->nSize = iVar5;
      if (__s != (int *)0x0) {
        memset(__s,0xff,(long)iVar5 << 2);
      }
      iVar10 = p->pFrames->nObjs[2];
      p_00 = (Vec_Int_t *)malloc(0x10);
      iVar11 = 0x10;
      if (0xe < iVar10 - 1U) {
        iVar11 = iVar10;
      }
      p_00->nSize = 0;
      p_00->nCap = iVar11;
      if (iVar11 == 0) {
        piVar6 = (int *)0x0;
      }
      else {
        piVar6 = (int *)malloc((long)iVar11 << 2);
      }
      p_00->pArray = piVar6;
      pVVar7 = p->pFrames->vCis;
      if (0 < pVVar7->nSize) {
        lVar12 = 0;
        do {
          pvVar3 = pVVar7->pArray[lVar12];
          Vec_IntPush(p_00,pCnf->pVarNums[*(int *)((long)pvVar3 + 0x24)] * 2 + 1);
          iVar10 = pCnf->pVarNums[*(int *)((long)pvVar3 + 0x24)];
          if (((long)iVar10 < 0) || (iVar5 <= iVar10)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          __s[iVar10] = (int)lVar12;
          lVar12 = lVar12 + 1;
          pVVar7 = p->pFrames->vCis;
        } while (lVar12 < pVVar7->nSize);
      }
      if (fNewOrder != 0) {
        pVVar8 = Saig_RefManOrderLiterals(p,vVar2PiId,p_00);
        ppvVar4 = pVVar8->pArray;
        uVar1 = pVVar8->nSize;
        uVar14 = (ulong)(int)uVar1;
        qsort(ppvVar4,uVar14,8,Vec_VecSortCompare2);
        p_00->nSize = 0;
        bVar15 = 0 < (long)uVar14;
        if (0 < (long)uVar14) {
          uVar13 = 0;
          do {
            if (!bVar15) goto LAB_006112c5;
            lVar12 = 0;
            while (lVar12 < *(int *)((long)ppvVar4[uVar13] + 4)) {
              Vec_IntPush(p_00,*(int *)(*(long *)((long)ppvVar4[uVar13] + 8) + lVar12 * 4));
              lVar12 = lVar12 + 1;
              if (!bVar15) goto LAB_006112c5;
            }
            uVar13 = uVar13 + 1;
            bVar15 = uVar13 < uVar14;
          } while (uVar13 != uVar14);
        }
        if (0 < (int)uVar1) {
          uVar13 = 0;
          do {
            printf("%d ",(ulong)*(uint *)((long)ppvVar4[uVar13] + 4));
            uVar13 = uVar13 + 1;
          } while (uVar14 != uVar13);
        }
        putchar(10);
        if (p->fVerbose != 0) {
          printf("Total PIs = %d. Essential PIs = %d.\n",
                 (ulong)(uint)(p->pAig->nTruePis - p->nInputs),(ulong)uVar1);
        }
      }
      clock_gettime(3,&local_40);
      begin = p_00->pArray;
      uVar1 = p_00->nSize;
      iVar5 = sat_solver_solve(s,begin,begin + (int)uVar1,1000000,0,0,0);
      if (iVar5 != -1) {
        if (iVar5 == 1) {
          __s_00 = "Internal Error!!! The resulting problem is SAT.";
        }
        else {
          __s_00 = "Internal Error!!! SAT solver timed out.";
        }
        puts(__s_00);
        Cnf_DataFree(pCnf);
        sat_solver_delete(s);
        if (begin != (lit *)0x0) {
          free(begin);
          p_00->pArray = (int *)0x0;
        }
        free(p_00);
        if (__s != (int *)0x0) {
          free(__s);
          vVar2PiId->pArray = (int *)0x0;
        }
        free(vVar2PiId);
        return (Abc_Cex_t *)0x0;
      }
      uVar2 = (s->conf_final).size;
      if ((int)uVar2 < 1) {
        __assert_fail("nCoreLits > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldSat.c"
                      ,0x25d,"Abc_Cex_t *Saig_RefManRunSat(Saig_RefMan_t *, int)");
      }
      piVar6 = (s->conf_final).ptr;
      if (p->fVerbose != 0) {
        printf("AnalizeFinal selected %d assumptions (out of %d). Conflicts = %d.\n",(ulong)uVar2,
               (ulong)uVar1,(ulong)(uint)(s->stats).conflicts);
      }
      p_00->nSize = 0;
      uVar14 = 1;
      if (1 < (int)uVar2) {
        uVar14 = (ulong)uVar2;
      }
      uVar13 = 0;
      do {
        Vec_IntPush(p_00,piVar6[uVar13]);
        uVar13 = uVar13 + 1;
      } while (uVar14 != uVar13);
      pVVar8 = Saig_RefManOrderLiterals(p,vVar2PiId,p_00);
      p_00->nSize = 0;
      uVar1 = pVVar8->nSize;
      uVar14 = (ulong)(int)uVar1;
      bVar15 = 0 < (long)uVar14;
      if (0 < (long)uVar14) {
        uVar13 = 0;
        do {
          if (!bVar15) {
LAB_006112c5:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                          ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
          }
          ppvVar4 = pVVar8->pArray;
          lVar12 = 0;
          while (lVar12 < *(int *)((long)ppvVar4[uVar13] + 4)) {
            Vec_IntPush(p_00,*(int *)(*(long *)((long)ppvVar4[uVar13] + 8) + lVar12 * 4));
            lVar12 = lVar12 + 1;
            if (!bVar15) goto LAB_006112c5;
          }
          uVar13 = uVar13 + 1;
          bVar15 = uVar13 < uVar14;
        } while (uVar13 != uVar14);
      }
      if (p->fVerbose != 0) {
        printf("Total PIs = %d. Essential PIs = %d.\n",(ulong)(uint)(p->pAig->nTruePis - p->nInputs)
               ,(ulong)uVar1);
      }
      pAVar9 = Saig_RefManCreateCex(p,vVar2PiId,p_00);
      Cnf_DataFree(pCnf);
      sat_solver_delete(s);
      if (p_00->pArray != (int *)0x0) {
        free(p_00->pArray);
        p_00->pArray = (int *)0x0;
      }
      free(p_00);
      if (__s != (int *)0x0) {
        free(__s);
        vVar2PiId->pArray = (int *)0x0;
      }
      free(vVar2PiId);
      if (pVVar8 != (Vec_Vec_t *)0x0) {
        if (0 < (int)uVar1) {
          ppvVar4 = pVVar8->pArray;
          uVar13 = 0;
          do {
            pvVar3 = ppvVar4[uVar13];
            if (pvVar3 != (void *)0x0) {
              if (*(void **)((long)pvVar3 + 8) != (void *)0x0) {
                free(*(void **)((long)pvVar3 + 8));
                *(undefined8 *)((long)pvVar3 + 8) = 0;
              }
              free(pvVar3);
            }
            uVar13 = uVar13 + 1;
          } while (uVar14 != uVar13);
        }
        if (pVVar8->pArray != (void **)0x0) {
          free(pVVar8->pArray);
          pVVar8->pArray = (void **)0x0;
        }
        free(pVVar8);
      }
      iVar5 = Saig_RefManSetPhases(p,pAVar9,0);
      if (iVar5 != 0) {
        puts("Reduced CEX verification has failed.");
      }
      iVar5 = Saig_RefManSetPhases(p,pAVar9,1);
      if (iVar5 != 0) {
        puts("Reduced CEX verification has failed.");
        return pAVar9;
      }
      return pAVar9;
    }
  }
  else {
    puts("Constructed frames are incorrect.");
  }
  Cnf_DataFree(pCnf);
  return (Abc_Cex_t *)0x0;
}

Assistant:

Abc_Cex_t * Saig_RefManRunSat( Saig_RefMan_t * p, int fNewOrder )
{
    int nConfLimit = 1000000;
    Abc_Cex_t * pCare;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    Vec_Vec_t * vLits = NULL;
    Vec_Int_t * vAssumps, * vVar2PiId;
    int i, k, Entry, RetValue;//, f = 0, Counter = 0;
    int nCoreLits, * pCoreLits;
    abctime clk = Abc_Clock();
    // create CNF
    assert( Aig_ManRegNum(p->pFrames) == 0 );
//    pCnf = Cnf_Derive( p->pFrames, 0 ); // too slow
    pCnf = Cnf_DeriveSimple( p->pFrames, 0 );
    RetValue = Saig_RefManSetPhases( p, NULL, 0 );
    if ( RetValue )
    {
        printf( "Constructed frames are incorrect.\n" );
        Cnf_DataFree( pCnf );
        return NULL;
    }
    Cnf_DataTranformPolarity( pCnf, 0 );
    // create SAT solver
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        return NULL;
    }
//Abc_PrintTime( 1, "Preparing", Abc_Clock() - clk );
    // look for a true counter-example
    if ( p->nInputs > 0 )
    {
        RetValue = sat_solver_solve( pSat, NULL, NULL, 
            (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( RetValue == l_False )
        {
            printf( "The problem is trivially UNSAT. The CEX is real.\n" );
            // create counter-example
            pCare = Abc_CexDup( p->pCex, p->pCex->nRegs );
            memset( pCare->pData, 0, sizeof(unsigned) * Abc_BitWordNum(pCare->nBits) );
            return pCare;
        }
        // the problem is SAT - it is expected
    }
    // create assumptions
    vVar2PiId = Vec_IntStartFull( pCnf->nVars );
    vAssumps = Vec_IntAlloc( Aig_ManCiNum(p->pFrames) );
    Aig_ManForEachCi( p->pFrames, pObj, i )
    {
//        RetValue = Abc_InfoHasBit( p->pCex->pData, p->pCex->nRegs + p->pCex->nPis * iFrame + iInput );
//        Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], !RetValue ) );
        Vec_IntPush( vAssumps, toLitCond( pCnf->pVarNums[Aig_ObjId(pObj)], 1 ) );
        Vec_IntWriteEntry( vVar2PiId, pCnf->pVarNums[Aig_ObjId(pObj)], i );
    }

    // reverse the order of assumptions
//    if ( fNewOrder )
//    Vec_IntReverseOrder( vAssumps );

    if ( fNewOrder )
    {
        // create literals
        vLits = Saig_RefManOrderLiterals( p, vVar2PiId, vAssumps );
        // sort literals
        Vec_VecSort( vLits, 1 );
        // save literals
        Vec_IntClear( vAssumps );
        Vec_VecForEachEntryInt( vLits, Entry, i, k )
            Vec_IntPush( vAssumps, Entry );

        for ( i = 0; i < Vec_VecSize(vLits); i++ )
            printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
        printf( "\n" );

        if ( p->fVerbose )
            printf( "Total PIs = %d. Essential PIs = %d.\n", 
                Saig_ManPiNum(p->pAig) - p->nInputs, Vec_VecSize(vLits) );
    }

    // solve
clk = Abc_Clock();
    RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
        (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
//Abc_PrintTime( 1, "Solving", Abc_Clock() - clk );
    if ( RetValue != l_False )
    {
        if ( RetValue == l_True )
            printf( "Internal Error!!! The resulting problem is SAT.\n" );
        else
            printf( "Internal Error!!! SAT solver timed out.\n" );
        Cnf_DataFree( pCnf );
        sat_solver_delete( pSat );
        Vec_IntFree( vAssumps );
        Vec_IntFree( vVar2PiId );
        return NULL;
    }
    assert( RetValue == l_False ); // UNSAT

    // get relevant SAT literals
    nCoreLits = sat_solver_final( pSat, &pCoreLits );
    assert( nCoreLits > 0 );
    if ( p->fVerbose )
    printf( "AnalizeFinal selected %d assumptions (out of %d). Conflicts = %d.\n", 
        nCoreLits, Vec_IntSize(vAssumps), (int)pSat->stats.conflicts );

    // save literals
    Vec_IntClear( vAssumps );
    for ( i = 0; i < nCoreLits; i++ )
        Vec_IntPush( vAssumps, pCoreLits[i] );


    // create literals
    vLits = Saig_RefManOrderLiterals( p, vVar2PiId, vAssumps );
    // sort literals
//    Vec_VecSort( vLits, 0 );
    // save literals
    Vec_IntClear( vAssumps );
    Vec_VecForEachEntryInt( vLits, Entry, i, k )
        Vec_IntPush( vAssumps, Entry );

//    for ( i = 0; i < Vec_VecSize(vLits); i++ )
//        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
//    printf( "\n" );

    if ( p->fVerbose )
        printf( "Total PIs = %d. Essential PIs = %d.\n", 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_VecSize(vLits) );
/*
    // try assumptions in different order
    RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
        (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
        Vec_IntSize(vAssumps), (RetValue == l_False ? "UNSAT" : "SAT"), (int)pSat->stats.conflicts );

    // create different sets of assumptions
    Counter = Vec_VecSize(vLits);
    for ( f = 0; f < Vec_VecSize(vLits); f++ )
    {
        Vec_IntClear( vAssumps );
        Vec_VecForEachEntryInt( vLits, Entry, i, k )
            if ( i != f )
                Vec_IntPush( vAssumps, Entry );

        // try the new assumptions
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vAssumps), Vec_IntArray(vAssumps) + Vec_IntSize(vAssumps), 
            (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        printf( "Assumpts = %2d. Intermediate instance is %5s. Conflicts = %2d.\n", 
            Vec_IntSize(vAssumps), RetValue == l_False ? "UNSAT" : "SAT", (int)pSat->stats.conflicts );
        if ( RetValue != l_False )
            continue;

        // UNSAT - remove literals
        Vec_IntClear( Vec_VecEntryInt(vLits, f) );
        Counter--;
    }

    for ( i = 0; i < Vec_VecSize(vLits); i++ )
        printf( "%d ", Vec_IntSize( Vec_VecEntryInt(vLits, i) ) );
    printf( "\n" );

    if ( p->fVerbose )
        printf( "Total PIs = %d. Essential PIs = %d.\n", 
            Saig_ManPiNum(p->pAig) - p->nInputs, Counter );

    // save literals
    Vec_IntClear( vAssumps );
    Vec_VecForEachEntryInt( vLits, Entry, i, k )
        Vec_IntPush( vAssumps, Entry );
*/
    // create counter-example
    pCare = Saig_RefManCreateCex( p, vVar2PiId, vAssumps );

    // cleanup
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    Vec_IntFree( vAssumps );
    Vec_IntFree( vVar2PiId );
    Vec_VecFreeP( &vLits );

    // verify counter-example
    RetValue = Saig_RefManSetPhases( p, pCare, 0 );
    if ( RetValue )
        printf( "Reduced CEX verification has failed.\n" );
    RetValue = Saig_RefManSetPhases( p, pCare, 1 );
    if ( RetValue )
        printf( "Reduced CEX verification has failed.\n" );
    return pCare;
}